

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrokerApp.cpp
# Opt level: O0

void __thiscall
helics::BrokerApp::BrokerApp
          (BrokerApp *this,CoreType ctype,string_view brokerName,string_view argString)

{
  ParseOutput PVar1;
  allocator<char> *__a;
  pointer phVar2;
  BrokerApp *in_RDX;
  CoreType in_ESI;
  long in_RDI;
  unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_> *in_R9;
  bool in_stack_00000027;
  BrokerApp *in_stack_00000028;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000038;
  helicsCLI11App *in_stack_00000040;
  unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_> app;
  undefined4 in_stack_ffffffffffffff50;
  basic_string_view<char,_std::char_traits<char>_> *__t;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  basic_string_view<char,_std::char_traits<char>_> local_2d;
  
  local_2d._M_len._1_4_ = in_ESI;
  CLI::std::shared_ptr<helics::Broker>::shared_ptr((shared_ptr<helics::Broker> *)0x447520);
  __a = (allocator<char> *)(in_RDI + 0x10);
  __t = &local_2d;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            (in_stack_ffffffffffffff90,__t,__a);
  std::allocator<char>::~allocator((allocator<char> *)&local_2d);
  generateParser(in_stack_00000028,in_stack_00000027);
  phVar2 = CLI::std::
           unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>::
           operator->((unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>
                       *)0x447591);
  helicsCLI11App::setDefaultCoreType(phVar2,local_2d._M_len._1_4_);
  phVar2 = CLI::std::
           unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>::
           operator->((unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>
                       *)0x4475b1);
  phVar2->passConfig = true;
  phVar2 = CLI::std::
           unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>::
           operator->((unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>
                       *)0x4475c2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            (in_stack_ffffffffffffff90,__t,__a);
  PVar1 = helicsCLI11App::helics_parse<std::__cxx11::string>(in_stack_00000040,in_stack_00000038);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(PVar1,in_stack_ffffffffffffff50));
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff97);
  if (PVar1 == OK) {
    processArgs(in_RDX,in_R9);
  }
  CLI::std::unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>::
  ~unique_ptr((unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_> *)
              phVar2);
  return;
}

Assistant:

BrokerApp::BrokerApp(CoreType ctype, std::string_view brokerName, std::string_view argString):
    name(brokerName)
{
    auto app = generateParser(ctype == CoreType::MULTI);
    app->setDefaultCoreType(ctype);
    app->passConfig = true;
    if (app->helics_parse(std::string(argString)) == helicsCLI11App::ParseOutput::OK) {
        processArgs(app);
    }
}